

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O0

void __thiscall Js::InlineCache::Dump(InlineCache *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  InlineCache *this_local;
  
  if (((ushort)(this->u).local.field_2 & 1) == 0) {
    if ((undefined1  [24])((undefined1  [24])this->u & (undefined1  [24])0x1) ==
        (undefined1  [24])0x0) {
      if (((this->u).accessor.field_1.rawUInt16 & 1) == 0) {
        if ((this->u).proto.prototypeObject != (DynamicObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                      ,0x26a,"(this->u.accessor.type == 0)",
                                      "this->u.accessor.type == 0");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
        if ((this->u).accessor.slotIndex != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                      ,0x26b,"(this->u.accessor.slotIndex == 0)",
                                      "this->u.accessor.slotIndex == 0");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
        Output::Print(L"uninitialized");
      }
      else {
        Output::Print(L"FLAGS { type = 0x%X, object = 0x%X, flag = 0x%X, slot = %d, list slot ptr = 0x%X }"
                      ,(this->u).proto.prototypeObject,(this->u).local.type,
                      (ulong)(this->u).accessor.slotIndex,
                      (ulong)((this->u).accessor.field_1.rawUInt16 >> 1 & 3),
                      this->invalidationListSlotPtr);
      }
    }
    else {
      Output::Print(L"PROTO { type = 0x%X, prototype = 0x%X, slot = %d, list slot ptr = 0x%X }",
                    (this->u).local.typeWithoutProperty,(this->u).proto.prototypeObject,
                    (ulong)(this->u).proto.slotIndex,this->invalidationListSlotPtr);
    }
  }
  else {
    Output::Print(L"LOCAL { types: 0x%X -> 0x%X, slot = %d, list slot ptr = 0x%X }",
                  (this->u).local.typeWithoutProperty,(this->u).local.type,
                  (ulong)(this->u).local.slotIndex,this->invalidationListSlotPtr);
  }
  return;
}

Assistant:

void InlineCache::Dump()
    {
        if (this->u.local.isLocal)
        {
            Output::Print(_u("LOCAL { types: 0x%X -> 0x%X, slot = %d, list slot ptr = 0x%X }"),
                this->u.local.typeWithoutProperty,
                this->u.local.type,
                this->u.local.slotIndex,
                this->invalidationListSlotPtr
                );
        }
        else if (this->u.proto.isProto)
        {
            Output::Print(_u("PROTO { type = 0x%X, prototype = 0x%X, slot = %d, list slot ptr = 0x%X }"),
                this->u.proto.type,
                this->u.proto.prototypeObject,
                this->u.proto.slotIndex,
                this->invalidationListSlotPtr
                );
        }
        else if (this->u.accessor.isAccessor)
        {
            Output::Print(_u("FLAGS { type = 0x%X, object = 0x%X, flag = 0x%X, slot = %d, list slot ptr = 0x%X }"),
                this->u.accessor.type,
                this->u.accessor.object,
                this->u.accessor.slotIndex,
                this->u.accessor.flags,
                this->invalidationListSlotPtr
                );
        }
        else
        {
            Assert(this->u.accessor.type == 0);
            Assert(this->u.accessor.slotIndex == 0);
            Output::Print(_u("uninitialized"));
        }
    }